

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O3

void __thiscall
cmSearchPath::AddPrefixPaths
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,char *base)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  cmValue cVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type sVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  pointer path;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string subdir;
  string add;
  string dir;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  char *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  char *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  string local_e0;
  cmSearchPath *local_b0;
  pointer local_a8;
  string local_a0;
  string local_80;
  string local_50;
  
  local_128 = base;
  if (this->FC == (cmFindCommon *)0x0) {
    __assert_fail("this->FC != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSearchPath.cxx"
                  ,0x9c,
                  "void cmSearchPath::AddPrefixPaths(const std::vector<std::string> &, const char *)"
                 );
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"bin","");
  iVar5 = std::__cxx11::string::compare((char *)&this->FC->CMakePathName);
  if (iVar5 == 0) {
    pcVar3 = "!include";
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&this->FC->CMakePathName);
    if (iVar5 != 0) {
      iVar5 = std::__cxx11::string::compare((char *)&this->FC->CMakePathName);
      if (iVar5 == 0) {
        local_188._M_string_length = 0;
        *local_188._M_dataplus._M_p = '\0';
      }
      goto LAB_002366d0;
    }
    pcVar3 = ".lib";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_188,0,(char *)local_188._M_string_length,(ulong)(pcVar3 + 1));
LAB_002366d0:
  path = (paths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (path != local_a8) {
    local_b0 = this;
    do {
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      pcVar1 = (path->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar1,pcVar1 + path->_M_string_length);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_120._M_string_length;
      if ((char *)local_188._M_string_length != (char *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_string_length ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        }
        else if ((local_120._M_dataplus._M_p + -1)[local_120._M_string_length] != '/') {
          std::__cxx11::string::append((char *)&local_120);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_120._M_string_length;
        }
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_100,local_120._M_dataplus._M_p,
                 paVar7->_M_local_buf + (long)local_120._M_dataplus._M_p);
      if ((local_100._M_string_length != 0) &&
         (iVar5 = std::__cxx11::string::compare((char *)&local_100), iVar5 != 0)) {
        sVar8 = local_100._M_string_length - 1;
        if (local_100._M_string_length == 0) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     sVar8,0);
        }
        local_100._M_dataplus._M_p[sVar8] = '\0';
        local_100._M_string_length = sVar8;
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_188);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_188), iVar5 == 0)) {
        pcVar2 = this->FC->Makefile;
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,"CMAKE_LIBRARY_ARCHITECTURE","");
        cVar6 = cmMakefile::GetDefinition(pcVar2,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        if ((cVar6.Value != (string *)0x0) && ((cVar6.Value)->_M_string_length != 0)) {
          pcVar2 = this->FC->Makefile;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"CMAKE_SYSROOT","");
          bVar4 = cmMakefile::IsDefinitionSet(pcVar2,&local_168);
          if (bVar4) {
            pcVar2 = this->FC->Makefile;
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"CMAKE_PREFIX_LIBRARY_ARCHITECTURE","");
            bVar4 = cmMakefile::IsDefinitionSet(pcVar2,&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,
                              CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                       local_e0.field_2._M_local_buf[0]) + 1);
            }
          }
          else {
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,
                            (ulong)(local_168.field_2._M_allocated_capacity + 1));
          }
          if (bVar4 == false) {
            local_168._M_dataplus._M_p = (pointer)local_120._M_string_length;
            local_168._M_string_length = (size_type)local_120._M_dataplus._M_p;
            local_168.field_2._M_allocated_capacity = local_188._M_string_length;
            local_168.field_2._8_8_ = local_188._M_dataplus._M_p;
            local_e0._M_dataplus._M_p = (pointer)0x1;
            local_140 = &local_e0.field_2;
            local_e0.field_2._M_local_buf[0] = '/';
            local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1;
            local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((cVar6.Value)->_M_dataplus)._M_p;
            local_138 = (char *)(cVar6.Value)->_M_string_length;
            views_01._M_len = 4;
            views_01._M_array = (iterator)&local_168;
            local_e0._M_string_length = (size_type)local_140;
            cmCatViews_abi_cxx11_(&local_80,views_01);
            AddPathInternal(this,&local_80,&local_100,local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              uVar9 = CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]);
              _Var10._M_p = local_80._M_dataplus._M_p;
              goto LAB_00236b3c;
            }
          }
          else {
            local_e0._M_dataplus._M_p = (pointer)0x1;
            local_168._M_string_length = (size_type)&local_e0.field_2;
            local_e0.field_2._M_local_buf[0] = '/';
            local_168.field_2._8_8_ = ((cVar6.Value)->_M_dataplus)._M_p;
            local_168.field_2._M_allocated_capacity = (cVar6.Value)->_M_string_length;
            local_168._M_dataplus._M_p = (pointer)0x1;
            local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_120._M_string_length;
            local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_120._M_dataplus._M_p;
            local_138 = (char *)local_188._M_string_length;
            local_130 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p;
            views._M_len = 4;
            views._M_array = (iterator)&local_168;
            local_e0._M_string_length = local_168._M_string_length;
            cmCatViews_abi_cxx11_(&local_a0,views);
            local_80._M_dataplus._M_p = (pointer)0x1;
            local_168._M_string_length = (size_type)&local_80.field_2;
            local_80.field_2._M_local_buf[0] = '/';
            local_168.field_2._8_8_ = ((cVar6.Value)->_M_dataplus)._M_p;
            local_168.field_2._M_allocated_capacity = (cVar6.Value)->_M_string_length;
            local_168._M_dataplus._M_p = (pointer)0x1;
            local_148 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_100._M_string_length;
            local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_100._M_dataplus._M_p;
            views_00._M_len = 3;
            views_00._M_array = (iterator)&local_168;
            local_80._M_string_length = local_168._M_string_length;
            cmCatViews_abi_cxx11_(&local_50,views_00);
            this = local_b0;
            AddPathInternal(local_b0,&local_a0,&local_50,local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            uVar9 = local_a0.field_2._M_allocated_capacity;
            _Var10._M_p = local_a0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
LAB_00236b3c:
              operator_delete(_Var10._M_p,uVar9 + 1);
            }
          }
        }
      }
      std::operator+(&local_168,&local_120,&local_188);
      iVar5 = std::__cxx11::string::compare((char *)&local_168);
      if (iVar5 != 0) {
        AddPathInternal(this,&local_168,&local_100,local_128);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_188);
      if (iVar5 == 0) {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e0,local_120._M_dataplus._M_p,
                   (char *)(local_120._M_string_length + (long)local_120._M_dataplus._M_p));
        std::__cxx11::string::append((char *)&local_e0);
        AddPathInternal(this,&local_e0,&local_100,local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                   local_e0.field_2._M_local_buf[0]) + 1);
        }
      }
      if (((char *)local_188._M_string_length != (char *)0x0) &&
         (iVar5 = std::__cxx11::string::compare((char *)path), iVar5 != 0)) {
        AddPathInternal(this,path,&local_100,local_128);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,
                        (ulong)(local_168.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      path = path + 1;
    } while (path != local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSearchPath::AddPrefixPaths(const std::vector<std::string>& paths,
                                  const char* base)
{
  assert(this->FC != nullptr);

  // default for programs
  std::string subdir = "bin";

  if (this->FC->CMakePathName == "INCLUDE") {
    subdir = "include";
  } else if (this->FC->CMakePathName == "LIBRARY") {
    subdir = "lib";
  } else if (this->FC->CMakePathName == "FRAMEWORK") {
    subdir.clear(); // ? what to do for frameworks ?
  }

  for (std::string const& path : paths) {
    std::string dir = path;
    if (!subdir.empty() && !dir.empty() && dir.back() != '/') {
      dir += "/";
    }
    std::string prefix = dir;
    if (!prefix.empty() && prefix != "/") {
      prefix.erase(prefix.size() - 1);
    }
    if (subdir == "include" || subdir == "lib") {
      cmValue arch =
        this->FC->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE");
      if (cmNonempty(arch)) {
        if (this->FC->Makefile->IsDefinitionSet("CMAKE_SYSROOT") &&
            this->FC->Makefile->IsDefinitionSet(
              "CMAKE_PREFIX_LIBRARY_ARCHITECTURE")) {
          this->AddPathInternal(cmStrCat('/', *arch, dir, subdir),
                                cmStrCat('/', *arch, prefix), base);
        } else {
          this->AddPathInternal(cmStrCat(dir, subdir, '/', *arch), prefix,
                                base);
        }
      }
    }
    std::string add = dir + subdir;
    if (add != "/") {
      this->AddPathInternal(add, prefix, base);
    }
    if (subdir == "bin") {
      this->AddPathInternal(dir + "sbin", prefix, base);
    }
    if (!subdir.empty() && path != "/") {
      this->AddPathInternal(path, prefix, base);
    }
  }
}